

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_rbtree.c
# Opt level: O2

void ngx_rbtree_insert(ngx_rbtree_t *tree,ngx_rbtree_node_t *node)

{
  ngx_rbtree_node_t *sentinel;
  ngx_rbtree_node_t *node_00;
  ngx_rbtree_node_t *pnVar1;
  ngx_rbtree_node_t *node_01;
  
  sentinel = tree->sentinel;
  if (tree->root == sentinel) {
    node->parent = (ngx_rbtree_node_t *)0x0;
    node->left = sentinel;
    node->right = sentinel;
    node->color = '\0';
    tree->root = node;
  }
  else {
    (*tree->insert)(tree->root,node,sentinel);
    while ((node != tree->root && (node_00 = node->parent, node_00->color != '\0'))) {
      node_01 = node_00->parent;
      pnVar1 = node_01->left;
      if (node_00 == pnVar1) {
        pnVar1 = node_01->right;
        if (pnVar1->color != '\0') goto LAB_0011c9aa;
        pnVar1 = node_00;
        if (node == node_00->right) {
          ngx_rbtree_left_rotate(&tree->root,sentinel,node_00);
          node_01 = node_00->parent->parent;
          pnVar1 = node_00->parent;
          node = node_00;
        }
        pnVar1->color = '\0';
        node_01->color = '\x01';
        ngx_rbtree_right_rotate(&tree->root,sentinel,node_01);
      }
      else if (pnVar1->color == '\0') {
        pnVar1 = node_00;
        if (node == node_00->left) {
          ngx_rbtree_right_rotate(&tree->root,sentinel,node_00);
          node_01 = node_00->parent->parent;
          pnVar1 = node_00->parent;
          node = node_00;
        }
        pnVar1->color = '\0';
        node_01->color = '\x01';
        ngx_rbtree_left_rotate(&tree->root,sentinel,node_01);
      }
      else {
LAB_0011c9aa:
        node_00->color = '\0';
        pnVar1->color = '\0';
        node_01->color = '\x01';
        node = node_01;
      }
    }
    tree->root->color = '\0';
  }
  return;
}

Assistant:

void
ngx_rbtree_insert(ngx_rbtree_t *tree, ngx_rbtree_node_t *node)
{
    ngx_rbtree_node_t  **root, *temp, *sentinel;

    /* a binary tree insert */

    root = &tree->root;
    sentinel = tree->sentinel;

    if (*root == sentinel) {
        node->parent = NULL;
        node->left = sentinel;
        node->right = sentinel;
        ngx_rbt_black(node);
        *root = node;

        return;
    }

    tree->insert(*root, node, sentinel);

    /* re-balance tree */

    while (node != *root && ngx_rbt_is_red(node->parent)) {

        if (node->parent == node->parent->parent->left) {
            temp = node->parent->parent->right;

            if (ngx_rbt_is_red(temp)) {
                ngx_rbt_black(node->parent);
                ngx_rbt_black(temp);
                ngx_rbt_red(node->parent->parent);
                node = node->parent->parent;

            } else {
                if (node == node->parent->right) {
                    node = node->parent;
                    ngx_rbtree_left_rotate(root, sentinel, node);
                }

                ngx_rbt_black(node->parent);
                ngx_rbt_red(node->parent->parent);
                ngx_rbtree_right_rotate(root, sentinel, node->parent->parent);
            }

        } else {
            temp = node->parent->parent->left;

            if (ngx_rbt_is_red(temp)) {
                ngx_rbt_black(node->parent);
                ngx_rbt_black(temp);
                ngx_rbt_red(node->parent->parent);
                node = node->parent->parent;

            } else {
                if (node == node->parent->left) {
                    node = node->parent;
                    ngx_rbtree_right_rotate(root, sentinel, node);
                }

                ngx_rbt_black(node->parent);
                ngx_rbt_red(node->parent->parent);
                ngx_rbtree_left_rotate(root, sentinel, node->parent->parent);
            }
        }
    }

    ngx_rbt_black(*root);
}